

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

char * __thiscall QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame(QGles2Buffer *this)

{
  uint uVar1;
  QRhiImplementation *pQVar2;
  Data *pDVar3;
  char *pcVar4;
  
  if (((this->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
       super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 4) == 0) {
    pQVar2 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
    pcVar4 = (char *)(**(code **)(*pQVar2[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.
                                   super_QVLABaseBase.ptr + 400))
                               (this->targetForDataOps,this->buffer);
    uVar1 = *(uint *)(pQVar2[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x5c);
    if ((uVar1 >> 0x19 & 1) == 0) {
      if ((this->data).d.size == 0) {
        pcVar4 = (char *)QByteArray::resize((longlong)&this->data);
      }
    }
    else {
      pcVar4 = (char *)(**(code **)(*pQVar2[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.
                                     super_QVLABaseBase.ptr + 0x550))
                                 (this->targetForDataOps,0,
                                  *(undefined4 *)&(this->super_QRhiBuffer).field_0x3c,10);
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      return pcVar4;
    }
  }
  pDVar3 = (this->data).d.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&this->data,(AllocationOption)(this->data).d.size);
  }
  return (this->data).d.ptr;
}

Assistant:

char *QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame()
{
    Q_ASSERT(m_type == Dynamic);
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        if (rhiD->caps.properMapBuffer) {
            return static_cast<char *>(rhiD->f->glMapBufferRange(targetForDataOps, 0, nonZeroSize,
                                                                 GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
        } else {
            // Need some storage for the data, use the otherwise unused 'data' member.
            if (data.isEmpty())
                data.resize(nonZeroSize);
        }
    }
    return data.data();
}